

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_zTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  size_t sVar1;
  uint uVar2;
  char *key;
  ulong uVar3;
  size_t allocsize;
  uint uVar4;
  ucvector decoded;
  ucvector local_68;
  LodePNGInfo *local_50;
  LodePNGDecompressSettings *local_48;
  size_t local_40;
  size_t local_38;
  ulong uVar5;
  
  local_68.data = (uchar *)0x0;
  local_68.size = 0;
  local_68.allocsize = 0;
  if (chunkLength == 0) {
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      uVar4 = (uint)uVar5;
      if (data[uVar5] == '\0') break;
      uVar4 = uVar4 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar5 < chunkLength);
  }
  uVar3 = (ulong)(uVar4 + 2);
  uVar2 = 0x4b;
  if (uVar3 < chunkLength) {
    if (uVar4 - 0x50 < 0xffffffb1) {
      uVar2 = 0x59;
    }
    else {
      local_40 = (size_t)uVar4;
      local_38 = local_40 + 1;
      local_50 = info;
      local_48 = zlibsettings;
      key = (char *)malloc(local_38);
      if (key != (char *)0x0) {
        key[uVar5] = '\0';
        if (uVar4 != 0) {
          memcpy(key,data,local_40);
        }
        if (data[local_38] == '\0') {
          if (uVar3 <= chunkLength) {
            uVar5 = (ulong)((int)chunkLength - (uVar4 + 2));
            if (local_48->custom_zlib ==
                (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr
                 *)0x0) {
              uVar2 = lodepng_zlib_decompress
                                (&local_68.data,&local_68.size,data + uVar3,uVar5,local_48);
            }
            else {
              uVar2 = (*local_48->custom_zlib)
                                (&local_68.data,&local_68.size,data + uVar3,uVar5,local_48);
            }
            sVar1 = local_68.size;
            if (uVar2 == 0) {
              allocsize = local_68.size + 1;
              uVar4 = ucvector_reserve(&local_68,allocsize);
              if (uVar4 != 0) {
                local_68.data[sVar1] = '\0';
                local_68.size = allocsize;
              }
              uVar2 = lodepng_add_text(local_50,key,(char *)local_68.data);
            }
          }
        }
        else {
          uVar2 = 0x48;
        }
        goto LAB_0010a047;
      }
      uVar2 = 0x53;
    }
  }
  key = (char *)0x0;
LAB_0010a047:
  free(key);
  local_68.size = 0;
  local_68.allocsize = 0;
  free(local_68.data);
  return uVar2;
}

Assistant:

static unsigned readChunk_zTXt(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;

  unsigned length, string2_begin;
  char *key = 0;
  ucvector decoded;

  ucvector_init(&decoded);

  while(!error) /*not really a while loop, only used to break on error*/ {
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 2 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    if(data[length + 1] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    string2_begin = length + 2;
    if(string2_begin > chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/

    length = (unsigned)chunkLength - string2_begin;
    /*will fail if zlib error, e.g. if length is too small*/
    error = zlib_decompress(&decoded.data, &decoded.size,
                            (unsigned char*)(&data[string2_begin]),
                            length, zlibsettings);
    if(error) break;
    ucvector_push_back(&decoded, 0);

    error = lodepng_add_text(info, key, (char*)decoded.data);

    break;
  }

  lodepng_free(key);
  ucvector_cleanup(&decoded);

  return error;
}